

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

int * Dau_DsdComputeMatches(char *p)

{
  byte bVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int pNested [12];
  int aiStack_38 [14];
  
  if (*p != '\0') {
    lVar2 = 0;
    piVar3 = Dau_DsdComputeMatches::pMatches;
    iVar4 = 0;
    do {
      *piVar3 = 0;
      bVar1 = p[lVar2];
      uVar6 = bVar1 - 0x28;
      if (uVar6 < 0x36) {
        if ((0x8000000100001U >> ((ulong)uVar6 & 0x3f) & 1) != 0) goto LAB_0050d26f;
        if ((0x20000000400002U >> ((ulong)uVar6 & 0x3f) & 1) == 0) goto LAB_0050d252;
LAB_0050d25e:
        lVar5 = (long)iVar4;
        iVar4 = iVar4 + -1;
        Dau_DsdComputeMatches::pMatches[aiStack_38[lVar5 + -1]] = (int)lVar2;
      }
      else {
LAB_0050d252:
        if (bVar1 == 0x7b) {
LAB_0050d26f:
          aiStack_38[iVar4] = (int)lVar2;
          if (10 < iVar4) {
            __assert_fail("nNested < DAU_MAX_VAR",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                          ,0x5c,"int *Dau_DsdComputeMatches(char *)");
          }
          iVar4 = iVar4 + 1;
        }
        else if (bVar1 == 0x7d) goto LAB_0050d25e;
      }
      piVar3 = piVar3 + 1;
      lVar5 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while (p[lVar5] != '\0');
    if (iVar4 != 0) {
      __assert_fail("nNested == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                    ,0x5e,"int *Dau_DsdComputeMatches(char *)");
    }
  }
  return Dau_DsdComputeMatches::pMatches;
}

Assistant:

int * Dau_DsdComputeMatches( char * p )
{
    static int pMatches[DAU_MAX_STR];
    int pNested[DAU_MAX_VAR];
    int v, nNested = 0;
    for ( v = 0; p[v]; v++ )
    {
        pMatches[v] = 0;
        if ( p[v] == '(' || p[v] == '[' || p[v] == '<' || p[v] == '{' )
            pNested[nNested++] = v;
        else if ( p[v] == ')' || p[v] == ']' || p[v] == '>' || p[v] == '}' )
            pMatches[pNested[--nNested]] = v;
        assert( nNested < DAU_MAX_VAR );
    }
    assert( nNested == 0 );
    return pMatches;
}